

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

void __thiscall
ON_3dmObjectAttributes::SetHatchBoundaryVisible(ON_3dmObjectAttributes *this,bool on)

{
  ON_3dmObjectAttributesPrivate *pOVar1;
  ON_3dmObjectAttributesPrivate *pOVar2;
  
  pOVar1 = this->m_private;
  pOVar2 = &DefaultAttributesPrivate;
  if (pOVar1 != (ON_3dmObjectAttributesPrivate *)0x0) {
    pOVar2 = pOVar1;
  }
  if (pOVar2->m_hatch_boundary_visible != on) {
    if (pOVar1 == (ON_3dmObjectAttributesPrivate *)0x0) {
      pOVar1 = (ON_3dmObjectAttributesPrivate *)operator_new(0x158);
      ON_3dmObjectAttributesPrivate::ON_3dmObjectAttributesPrivate(pOVar1,this);
      this->m_private = pOVar1;
    }
    this->m_private->m_hatch_boundary_visible = on;
  }
  return;
}

Assistant:

void ON_3dmObjectAttributes::SetHatchBoundaryVisible(bool on)
{
  if (HatchBoundaryVisible() == on)
    return;

  if (nullptr == m_private)
    m_private = new ON_3dmObjectAttributesPrivate(this);
  m_private->m_hatch_boundary_visible = on;
}